

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.h
# Opt level: O1

void __thiscall UnifiedRegex::AltNode::AltNode(AltNode *this,Node *head,AltNode *tail)

{
  undefined1 *puVar1;
  
  (this->super_Node).tag = Alt;
  (this->super_Node).features = 0;
  puVar1 = &(this->super_Node).field_0xc;
  *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
  (this->super_Node).firstSet = (CharSet<char16_t> *)0x0;
  (this->super_Node).followSet = (CharSet<char16_t> *)0x0;
  (this->super_Node).prevConsumes.lower = 0;
  *(undefined8 *)&(this->super_Node).prevConsumes.upper = 0xffffffff;
  *(undefined8 *)&(this->super_Node).thisConsumes.upper = 0xffffffff;
  (this->super_Node).followConsumes.upper = 0xffffffff;
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
  this->head = head;
  this->tail = tail;
  this->runtimeTrie = (RuntimeCharTrie *)0x0;
  this->scheme = Try;
  this->isOptional = false;
  this->switchSize = 0;
  return;
}

Assistant:

inline AltNode(Node* head, AltNode* tail)
            : Node(Alt)
            , head(head)
            , tail(tail)
            , scheme(Try)
            , runtimeTrie(0)
            , isOptional(false)
            , switchSize(0)
        {
        }